

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

Value __thiscall
jsonnet::internal::(anonymous_namespace)::Interpreter::
makeObject<jsonnet::internal::(anonymous_namespace)::HeapComprehensionObject,std::map<jsonnet::internal::Identifier_const*,jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::less<jsonnet::internal::Identifier_const*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*const,jsonnet::internal::(anonymous_namespace)::HeapThunk*>>>,jsonnet::internal::AST_const*,jsonnet::internal::Identifier_const*,std::map<jsonnet::internal::Identifier_const*,jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::less<jsonnet::internal::Identifier_const*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*const,jsonnet::internal::(anonymous_namespace)::HeapThunk*>>>>
          (Interpreter *this,
          map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
          *args,AST *args_1,Identifier *args_2,
          map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
          *args_3)

{
  anon_union_8_3_4e909c26_for_v aVar1;
  Value VVar2;
  Value r;
  Identifier **in_stack_00000038;
  AST **in_stack_00000040;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  *in_stack_00000048;
  Interpreter *in_stack_00000050;
  
  aVar1.h = (HeapEntity *)
            makeHeap<jsonnet::internal::(anonymous_namespace)::HeapComprehensionObject,std::map<jsonnet::internal::Identifier_const*,jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::less<jsonnet::internal::Identifier_const*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*const,jsonnet::internal::(anonymous_namespace)::HeapThunk*>>>&,jsonnet::internal::AST_const*&,jsonnet::internal::Identifier_const*&,std::map<jsonnet::internal::Identifier_const*,jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::less<jsonnet::internal::Identifier_const*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*const,jsonnet::internal::(anonymous_namespace)::HeapThunk*>>>&>
                      (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038,r.v.h
                      );
  VVar2.v.h = aVar1.h;
  VVar2._0_8_ = 0x12;
  return VVar2;
}

Assistant:

Value makeObject(Args... args)
    {
        Value r;
        r.t = Value::OBJECT;
        r.v.h = makeHeap<T>(args...);
        return r;
    }